

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vw_validate.cc
# Opt level: O0

void VW::validate_num_bits(vw *all)

{
  ostream *poVar1;
  undefined8 uVar2;
  long in_RDI;
  stringstream __msg;
  undefined7 in_stack_fffffffffffffe38;
  undefined1 uVar3;
  int in_stack_fffffffffffffe44;
  char *in_stack_fffffffffffffe48;
  vw_exception *in_stack_fffffffffffffe50;
  stringstream local_190 [16];
  ostream local_180;
  
  if (0x3d < *(uint *)(in_RDI + 0x50)) {
    std::__cxx11::stringstream::stringstream(local_190);
    poVar1 = std::operator<<(&local_180,"Only ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x3d);
    std::operator<<(poVar1," or fewer bits allowed.  If this is a serious limit, speak up.");
    uVar3 = 1;
    uVar2 = __cxa_allocate_exception(0x38);
    std::__cxx11::stringstream::str();
    vw_exception::vw_exception
              (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,in_stack_fffffffffffffe44,
               (string *)CONCAT17(uVar3,in_stack_fffffffffffffe38));
    __cxa_throw(uVar2,&vw_exception::typeinfo,vw_exception::~vw_exception);
  }
  return;
}

Assistant:

void validate_num_bits(vw& all)
{
  if (all.num_bits > sizeof(size_t) * 8 - 3)
    THROW("Only " << sizeof(size_t) * 8 - 3 << " or fewer bits allowed.  If this is a serious limit, speak up.");
}